

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

bool __thiscall HighsSparseMatrix::debugPartitionOk(HighsSparseMatrix *this,int8_t *in_partition)

{
  bool bVar1;
  const_reference pvVar2;
  long in_RSI;
  long in_RDI;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsInt iRow;
  bool ok;
  int local_20;
  int local_1c;
  int local_18;
  
  bVar1 = true;
  local_18 = 0;
  do {
    if (*(int *)(in_RDI + 8) <= local_18) {
      return bVar1;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),(long)local_18);
    for (local_1c = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_18),
        local_1c < *pvVar2; local_1c = local_1c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_1c);
      if (*(char *)(in_RSI + *pvVar2) == '\0') {
        bVar1 = false;
        break;
      }
    }
    if (bVar1 == false) {
      return false;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28),(long)local_18);
    for (local_20 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x10),
                            (long)(local_18 + 1)), local_20 < *pvVar2; local_20 = local_20 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_20);
      if (*(char *)(in_RSI + *pvVar2) != '\0') {
        bVar1 = false;
        break;
      }
    }
    if (bVar1 == false) {
      return false;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool HighsSparseMatrix::debugPartitionOk(const int8_t* in_partition) const {
  assert(this->format_ == MatrixFormat::kRowwisePartitioned);
  bool ok = true;
  for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
    for (HighsInt iEl = this->start_[iRow]; iEl < this->p_end_[iRow]; iEl++) {
      if (!in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
    for (HighsInt iEl = this->p_end_[iRow]; iEl < this->start_[iRow + 1];
         iEl++) {
      if (in_partition[this->index_[iEl]]) {
        ok = false;
        break;
      }
    }
    if (!ok) break;
  }
  return ok;
}